

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

IceTImage icetImageUnpackageFromReceive(IceTVoid *buffer)

{
  IceTEnum color_format_00;
  IceTEnum depth_format_00;
  IceTSizeType IVar1;
  IceTSizeType height;
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTVoid *buffer_local;
  IceTImage image;
  
  if (*buffer == 0x4d5000) {
    color_format_00 = icetImageGetColorFormat((IceTImage)buffer);
    if (((color_format_00 == 0xc001) || (color_format_00 == 0xc002)) || (color_format_00 == 0xc000))
    {
      depth_format_00 = icetImageGetDepthFormat((IceTImage)buffer);
      if ((depth_format_00 == 0xd001) || (depth_format_00 == 0xd000)) {
        IVar1 = icetImageGetWidth((IceTImage)buffer);
        height = icetImageGetHeight((IceTImage)buffer);
        IVar1 = icetImageBufferSizeType(color_format_00,depth_format_00,IVar1,height);
        if (IVar1 == *(int *)((long)buffer + 0x18)) {
          IVar1 = icetImageGetNumPixels((IceTImage)buffer);
          *(IceTSizeType *)((long)buffer + 0x14) = IVar1;
          buffer_local = buffer;
        }
        else {
          icetRaiseDiagnostic("Inconsistent sizes in image data.",0xfffffffa,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x47b);
          buffer_local = (IceTVoid *)0x0;
        }
      }
      else {
        icetRaiseDiagnostic("Invalid image buffer: invalid depth format.",0xfffffffa,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                            ,0x472);
        buffer_local = (IceTVoid *)0x0;
      }
    }
    else {
      icetRaiseDiagnostic("Invalid image buffer: invalid color format.",0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x469);
      buffer_local = (IceTVoid *)0x0;
    }
  }
  else {
    icetRaiseDiagnostic("Invalid image buffer: no magic number.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x45f);
    buffer_local = (IceTVoid *)0x0;
  }
  return (IceTImage)buffer_local;
}

Assistant:

IceTImage icetImageUnpackageFromReceive(IceTVoid *buffer)
{
    IceTImage image;
    IceTEnum color_format, depth_format;

    image.opaque_internals = buffer;

  /* Check the image for validity. */
    if (    ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAGIC_NUM_INDEX]
         != ICET_IMAGE_MAGIC_NUM ) {
        icetRaiseError("Invalid image buffer: no magic number.",
                       ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

    color_format = icetImageGetColorFormat(image);
    if (    (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
         && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
         && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid image buffer: invalid color format.",
                       ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

    depth_format = icetImageGetDepthFormat(image);
    if (    (depth_format != ICET_IMAGE_DEPTH_FLOAT)
         && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid image buffer: invalid depth format.",
                       ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

    if (    icetImageBufferSizeType(color_format, depth_format,
                                    icetImageGetWidth(image),
                                    icetImageGetHeight(image))
         != ICET_IMAGE_HEADER(image)[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX] ) {
        icetRaiseError("Inconsistent sizes in image data.", ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

  /* The source may have used a bigger buffer than allocated here at the
     receiver.  Record only size that holds current image. */
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]
        = (IceTInt)icetImageGetNumPixels(image);

  /* The image is valid (as far as we can tell). */
    return image;
}